

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O3

void __thiscall JSONNode::clear(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  internalJSONNode *piVar3;
  json_string local_38;
  
  piVar3 = this->internal;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar3 != (internalJSONNode *)0x0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  bVar2 = empty(this);
  if (!bVar2) {
    local_38.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_38.field_2._7_4_ = 0x6c616e72;
    local_38._M_string_length = 0xb;
    local_38.field_2._M_local_buf[0xb] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    piVar3 = internalJSONNode::makeUnique(this->internal);
    this->internal = piVar3;
    jsonChildren::clear(piVar3->Children);
  }
  return;
}

Assistant:

inline void JSONNode::clear(void) json_nothrow {
    JSON_CHECK_INTERNAL();
    if (!empty()){
	   makeUniqueInternal();
	   internal -> CHILDREN -> clear();
    }
}